

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O2

DdNode ** Cudd_bddCharToVect(DdManager *dd,DdNode *f)

{
  int *piVar1;
  DdNode **__ptr;
  DdNode *pDVar2;
  long lVar3;
  long lVar4;
  
  if ((DdNode *)((ulong)dd->one ^ 1) != f) {
    __ptr = (DdNode **)malloc((long)dd->size << 3);
    if (__ptr != (DdNode **)0x0) {
      pDVar2 = (DdNode *)0x0;
LAB_00655a41:
      do {
        dd->reordered = 0;
        lVar3 = 0;
        while( true ) {
          if (dd->size <= lVar3) goto LAB_00655a9c;
          pDVar2 = cuddBddCharToVect(dd,f,dd->vars[dd->invperm[lVar3]]);
          if (pDVar2 == (DdNode *)0x0) break;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          __ptr[dd->invperm[lVar3]] = pDVar2;
          lVar3 = lVar3 + 1;
        }
        for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
          Cudd_IterDerefBdd(dd,__ptr[dd->invperm[lVar4]]);
        }
        pDVar2 = (DdNode *)0x0;
        if (dd->reordered != 1) goto LAB_00655af3;
      } while( true );
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode **)0x0;
LAB_00655a9c:
  if (dd->reordered != 1) {
    if (pDVar2 != (DdNode *)0x0) {
      return __ptr;
    }
LAB_00655af3:
    free(__ptr);
    return (DdNode **)0x0;
  }
  goto LAB_00655a41;
}

Assistant:

DdNode **
Cudd_bddCharToVect(
  DdManager * dd,
  DdNode * f)
{
    int i, j;
    DdNode **vect;
    DdNode *res = NULL;

    if (f == Cudd_Not(DD_ONE(dd))) return(NULL);

    vect = ABC_ALLOC(DdNode *, dd->size);
    if (vect == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    do {
        dd->reordered = 0;
        for (i = 0; i < dd->size; i++) {
            res = cuddBddCharToVect(dd,f,dd->vars[dd->invperm[i]]);
            if (res == NULL) {
                /* Clean up the vector array in case reordering took place. */
                for (j = 0; j < i; j++) {
                    Cudd_IterDerefBdd(dd, vect[dd->invperm[j]]);
                }
                break;
            }
            cuddRef(res);
            vect[dd->invperm[i]] = res;
        }
    } while (dd->reordered == 1);
    if (res == NULL) {
        ABC_FREE(vect);
        return(NULL);
    }
    return(vect);

}